

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall
cppgenerate::Class::printVariables(Class *this,ostream *stream,AccessModifier modifier)

{
  bool bVar1;
  bool bVar2;
  AccessModifier AVar3;
  reference other;
  ostream *this_00;
  undefined1 local_f8 [8];
  MemberVariable variable;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_> *__range1;
  string local_40 [8];
  string accessString;
  bool havePrinted;
  AccessModifier modifier_local;
  ostream *stream_local;
  Class *this_local;
  
  bVar1 = false;
  std::__cxx11::string::string(local_40);
  if (modifier == PUBLIC) {
    std::__cxx11::string::operator=(local_40,"public:");
  }
  else if (modifier == PRIVATE) {
    std::__cxx11::string::operator=(local_40,"private:");
  }
  else if (modifier == PROTECTED) {
    std::__cxx11::string::operator=(local_40,"protected:");
  }
  __end1 = std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::
           begin(&this->m_memberVariables);
  variable._136_8_ =
       std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::end
                 (&this->m_memberVariables);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
                                     *)&variable.field_0x88), bVar2) {
    other = __gnu_cxx::
            __normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
            ::operator*(&__end1);
    MemberVariable::MemberVariable((MemberVariable *)local_f8,other);
    AVar3 = MemberVariable::accessModifier((MemberVariable *)local_f8);
    if (AVar3 == modifier) {
      if (!bVar1) {
        this_00 = std::operator<<(stream,local_40);
        std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
        bVar1 = true;
      }
      MemberVariable::print((MemberVariable *)local_f8,stream,4,false);
    }
    MemberVariable::~MemberVariable((MemberVariable *)local_f8);
    __gnu_cxx::
    __normal_iterator<const_cppgenerate::MemberVariable_*,_std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Class::printVariables( std::ostream& stream, AccessModifier modifier ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::MemberVariable variable : m_memberVariables ){
        if( variable.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        variable.print( stream, 4, false );
    }
}